

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::SetUriPath
          (Error *__return_storage_ptr__,Message *this,string *aUriPath)

{
  bool bVar1;
  Error *pEVar2;
  ErrorCode local_cc;
  OptionValue local_c8;
  Error local_b0;
  ErrorCode local_84;
  Error local_80;
  undefined1 local_48 [8];
  string NormalizedUriPath;
  string *aUriPath_local;
  Message *this_local;
  Error *error;
  
  NormalizedUriPath.field_2._M_local_buf[0xf] = '\0';
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_48,(string *)aUriPath);
  NormalizeUriPath(&local_80,(string *)local_48);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_80);
  local_84 = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_84);
  Error::~Error(&local_80);
  if (!bVar1) {
    OptionValue::OptionValue(&local_c8,(string *)local_48);
    AppendOption(&local_b0,this,kUriPath,&local_c8);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_b0);
    local_cc = kNone;
    commissioner::operator!=(pEVar2,&local_cc);
    Error::~Error(&local_b0);
    OptionValue::~OptionValue(&local_c8);
  }
  NormalizedUriPath.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((NormalizedUriPath.field_2._M_local_buf[0xf] & 1U) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::SetUriPath(const std::string &aUriPath)
{
    Error       error;
    std::string NormalizedUriPath = aUriPath;

    SuccessOrExit(error = NormalizeUriPath(NormalizedUriPath));
    SuccessOrExit(error = AppendOption(OptionType::kUriPath, OptionValue{NormalizedUriPath}));

exit:
    return error;
}